

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O3

void __thiscall
cs::stack_type<std::function<bool_(void_*)>,_std::allocator>::destroy
          (stack_type<std::function<bool_(void_*)>,_std::allocator> *this)

{
  _Any_data *p_Var1;
  _Any_data *p_Var2;
  _Any_data *p_Var3;
  _Any_data *p_Var4;
  
  p_Var3 = (_Any_data *)this->m_start;
  p_Var4 = (_Any_data *)this->m_current;
  if (p_Var4 != p_Var3) {
    do {
      p_Var1 = p_Var4 + -2;
      this->m_current = (function<bool_(void_*)> *)p_Var1;
      p_Var2 = p_Var4 + -1;
      p_Var4 = p_Var1;
      if (*(code **)p_Var2 != (code *)0x0) {
        (**(code **)p_Var2)(p_Var1,p_Var1,__destroy_functor);
        p_Var3 = (_Any_data *)this->m_start;
        p_Var4 = (_Any_data *)this->m_current;
      }
    } while (p_Var4 != p_Var3);
  }
  operator_delete(this->m_data,this->m_size << 5);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}